

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O2

quad_value_bit_vector *
bsim::xorr(quad_value_bit_vector *__return_storage_ptr__,quad_value_bit_vector *a)

{
  bool bVar1;
  byte bVar2;
  int i;
  long lVar3;
  quad_value local_51;
  string local_50;
  
  bVar2 = 0;
  for (lVar3 = 0; lVar3 < a->N; lVar3 = lVar3 + 1) {
    local_50._M_dataplus._M_p._0_1_ =
         (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
         super__Vector_impl_data._M_start[lVar3].value;
    local_51.value = '\x01';
    bVar1 = operator==((quad_value *)&local_50,&local_51);
    bVar2 = bVar2 + bVar1;
  }
  if ((bVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)&local_50,"0",(allocator *)&local_51);
    quad_value_bit_vector::quad_value_bit_vector(__return_storage_ptr__,1,&local_50);
  }
  else {
    std::__cxx11::string::string((string *)&local_50,"1",(allocator *)&local_51);
    quad_value_bit_vector::quad_value_bit_vector(__return_storage_ptr__,1,&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

static inline quad_value_bit_vector
  xorr(const quad_value_bit_vector& a) {
    int numSet = 0;
    for (int i = 0; i < a.bitLength(); i++) {
      if (a.get(i) == 1) {
	numSet++;
      }
    }

    if ((numSet % 2) == 0) {
      return quad_value_bit_vector(1, "0");
    }

    return quad_value_bit_vector(1, "1");
  }